

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.h
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionEulerSimple::SetAsRectangularSection
          (ChBeamSectionEulerSimple *this,double width_y,double width_z)

{
  undefined1 auVar1 [16];
  double dVar2;
  double __x;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  
  this->Area = width_y * width_z;
  dVar2 = pow(width_y,3.0);
  this->Izz = dVar2 * width_z * 0.08333333333333333;
  dVar2 = pow(width_z,3.0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = width_z;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = width_y;
  this->Iyy = dVar2 * width_y * 0.08333333333333333;
  auVar1 = vminsd_avx(auVar5,auVar6);
  auVar3 = vmaxsd_avx(auVar5,auVar6);
  dVar2 = pow(auVar1._0_8_,3.0);
  __x = auVar1._0_8_ / auVar3._0_8_;
  auVar4._0_8_ = pow(__x,4.0);
  auVar4._8_56_ = extraout_var;
  auVar1 = vfmadd132sd_fma(auVar4._0_16_,ZEXT816(0x3ff0000000000000),ZEXT816(0xbfb5555555555555));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = __x * -0.21;
  auVar1 = vfmadd213sd_fma(auVar7,auVar1,ZEXT816(0x3fd5555555555555));
  this->J = auVar1._0_8_ * auVar3._0_8_ * dVar2;
  dVar2 = this->E / (this->G + this->G) + -1.0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar2;
  auVar3 = vfmadd213sd_fma(ZEXT816(0x4026000000000000),auVar3,ZEXT816(0x4028000000000000));
  dVar2 = ((dVar2 + 1.0) * 10.0) / auVar3._0_8_;
  this->Ks_y = dVar2;
  this->Ks_z = dVar2;
  ChBeamSection::SetDrawThickness((ChBeamSection *)this,width_y,width_z);
  return;
}

Assistant:

void SetAsRectangularSection(double width_y, double width_z) {
        this->Area = width_y * width_z;
        this->Izz = (1.0 / 12.0) * width_z * pow(width_y, 3);
        this->Iyy = (1.0 / 12.0) * width_y * pow(width_z, 3);

        // use Roark's formulas for torsion of rectangular sect:
        double t = ChMin(width_y, width_z);
        double b = ChMax(width_y, width_z);
        this->J = b * pow(t, 3) * ((1.0 / 3.0) - 0.210 * (t / b) * (1.0 - (1.0 / 12.0) * pow((t / b), 4)));

        // set Ks using Timoshenko-Gere formula for solid rect.shapes
        double poisson = this->E / (2.0 * this->G) - 1.0;
        this->Ks_y = 10.0 * (1.0 + poisson) / (12.0 + 11.0 * poisson);
        this->Ks_z = this->Ks_y;

        this->SetDrawThickness(width_y, width_z);
    }